

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O2

void uv__udp_sendmsg(uv_udp_t *handle)

{
  void **ppvVar1;
  short sVar2;
  void *pvVar3;
  undefined8 *puVar4;
  int iVar5;
  long *plVar6;
  int *piVar7;
  long lVar8;
  uint uVar9;
  ulong uVar10;
  void **ppvVar11;
  socklen_t sVar12;
  ulong uVar13;
  uv__mmsghdr local_538 [20];
  
  uv_once(&once,uv__udp_mmsg_init);
  if (uv__sendmmsg_avail == '\0') {
    while (plVar6 = (long *)handle->write_queue[0], handle->write_queue != (void **)plVar6) {
      if (plVar6 == (long *)0x0) {
        __assert_fail("q != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/src/unix/udp.c"
                      ,0x1a2,"void uv__udp_sendmsg(uv_udp_t *)");
      }
      local_538[0].msg_hdr.msg_control = (void *)0x0;
      local_538[0].msg_hdr.msg_controllen = 0;
      local_538[0].msg_hdr.msg_flags = 0;
      local_538[0].msg_hdr._52_4_ = 0;
      local_538[0].msg_hdr.msg_iov = (iovec *)0x0;
      local_538[0].msg_hdr.msg_iovlen = 0;
      local_538[0].msg_hdr.msg_name = (long *)0x0;
      local_538[0].msg_hdr._8_8_ = 0;
      sVar2 = (short)plVar6[2];
      if (sVar2 != 0) {
        local_538[0].msg_hdr.msg_name = plVar6 + 2;
        if (sVar2 == 1) {
          uVar9 = 0x6e;
        }
        else {
          uVar9 = 0x1c;
          if (sVar2 != 10) {
            if (sVar2 != 2) {
              __assert_fail("0 && \"unsupported address family\"",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/src/unix/udp.c"
                            ,0x1b4,"void uv__udp_sendmsg(uv_udp_t *)");
            }
            uVar9 = 0x10;
          }
        }
        local_538[0].msg_hdr._12_4_ = 0;
        local_538[0].msg_hdr.msg_namelen = uVar9;
      }
      local_538[0].msg_hdr.msg_iov = (iovec *)plVar6[0x13];
      local_538[0].msg_hdr.msg_iovlen = (size_t)*(uint *)(plVar6 + 0x12);
      do {
        lVar8 = sendmsg((handle->io_watcher).fd,(msghdr *)local_538,0);
        if (lVar8 != -1) goto LAB_0017774d;
        piVar7 = __errno_location();
        iVar5 = *piVar7;
      } while ((long)iVar5 == 4);
      if (iVar5 == 0xb) {
        return;
      }
      if (iVar5 == 0x69) {
        return;
      }
      lVar8 = -(long)iVar5;
LAB_0017774d:
      plVar6[0x14] = lVar8;
      lVar8 = *plVar6;
      *(long *)plVar6[1] = lVar8;
      *(long *)(lVar8 + 8) = plVar6[1];
      *plVar6 = (long)handle->write_completed_queue;
      puVar4 = (undefined8 *)handle->write_completed_queue[1];
      plVar6[1] = (long)puVar4;
      *puVar4 = plVar6;
      handle->write_completed_queue[1] = plVar6;
      uv__io_feed(handle->loop,&handle->io_watcher);
    }
  }
  else {
    ppvVar1 = handle->write_queue;
    plVar6 = (long *)handle->write_queue[0];
    if (ppvVar1 != (void **)plVar6) {
      uVar13 = 0;
      while( true ) {
        for (; uVar13 < 0x14 && (void **)plVar6 != ppvVar1; uVar13 = uVar13 + 1) {
          if (plVar6 == (long *)0x0) {
            __assert_fail("q != NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/src/unix/udp.c"
                          ,0x148,"void uv__udp_sendmmsg(uv_udp_t *)");
          }
          *(undefined8 *)&local_538[uVar13].msg_hdr.msg_flags = 0;
          *(undefined8 *)&local_538[uVar13].msg_len = 0;
          local_538[uVar13].msg_hdr.msg_control = (void *)0x0;
          local_538[uVar13].msg_hdr.msg_controllen = 0;
          local_538[uVar13].msg_hdr.msg_iov = (iovec *)0x0;
          local_538[uVar13].msg_hdr.msg_iovlen = 0;
          local_538[uVar13].msg_hdr.msg_name = (void *)0x0;
          *(undefined8 *)&local_538[uVar13].msg_hdr.msg_namelen = 0;
          sVar2 = (short)plVar6[2];
          if (sVar2 != 0) {
            local_538[uVar13].msg_hdr.msg_name = plVar6 + 2;
            if (sVar2 == 1) {
              sVar12 = 0x6e;
            }
            else {
              sVar12 = 0x1c;
              if (sVar2 != 10) {
                if (sVar2 != 2) {
                  __assert_fail("0 && \"unsupported address family\"",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/src/unix/udp.c"
                                ,0x15a,"void uv__udp_sendmmsg(uv_udp_t *)");
                }
                sVar12 = 0x10;
              }
            }
            local_538[uVar13].msg_hdr.msg_namelen = sVar12;
          }
          local_538[uVar13].msg_hdr.msg_iov = (iovec *)plVar6[0x13];
          local_538[uVar13].msg_hdr.msg_iovlen = (ulong)*(uint *)(plVar6 + 0x12);
          plVar6 = (long *)*plVar6;
        }
        while (iVar5 = uv__sendmmsg((handle->io_watcher).fd,local_538,(uint)uVar13,0), iVar5 == -1)
        {
          piVar7 = __errno_location();
          iVar5 = *piVar7;
          if (iVar5 != 4) goto LAB_00177798;
        }
        if (iVar5 < 1) break;
        uVar10 = 0;
        while ((plVar6 = (long *)*ppvVar1, uVar10 < uVar13 && ((void **)plVar6 != ppvVar1))) {
          if (plVar6 == (long *)0x0) {
            __assert_fail("q != NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/src/unix/udp.c"
                          ,0x17b,"void uv__udp_sendmmsg(uv_udp_t *)");
          }
          plVar6[0x14] = *(long *)(plVar6[0x13] + 8);
          lVar8 = *plVar6;
          *(long *)plVar6[1] = lVar8;
          *(long *)(lVar8 + 8) = plVar6[1];
          *plVar6 = (long)handle->write_completed_queue;
          puVar4 = (undefined8 *)handle->write_completed_queue[1];
          plVar6[1] = (long)puVar4;
          *puVar4 = plVar6;
          handle->write_completed_queue[1] = plVar6;
          uVar10 = uVar10 + 1;
        }
        uVar13 = 0;
        if (ppvVar1 == (void **)plVar6) goto LAB_001777f3;
      }
      piVar7 = __errno_location();
      iVar5 = *piVar7;
LAB_00177798:
      if (iVar5 == 0xb) {
        return;
      }
      if (iVar5 == 0x69) {
        return;
      }
      uVar10 = 0;
      ppvVar11 = ppvVar1;
      while ((uVar10 < uVar13 && (ppvVar11 = (void **)*ppvVar11, ppvVar11 != ppvVar1))) {
        if (ppvVar11 == (void **)0x0) {
          __assert_fail("q != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/src/unix/udp.c"
                        ,0x16c,"void uv__udp_sendmmsg(uv_udp_t *)");
        }
        ppvVar11[0x14] = (void *)(long)-iVar5;
        pvVar3 = *ppvVar11;
        *(void **)ppvVar11[1] = pvVar3;
        *(void **)((long)pvVar3 + 8) = ppvVar11[1];
        *ppvVar11 = handle->write_completed_queue;
        puVar4 = (undefined8 *)handle->write_completed_queue[1];
        ppvVar11[1] = puVar4;
        *puVar4 = ppvVar11;
        handle->write_completed_queue[1] = ppvVar11;
        uVar10 = uVar10 + 1;
      }
LAB_001777f3:
      uv__io_feed(handle->loop,&handle->io_watcher);
    }
  }
  return;
}

Assistant:

static void uv__udp_sendmsg(uv_udp_t* handle) {
  uv_udp_send_t* req;
  struct msghdr h;
  QUEUE* q;
  ssize_t size;

#if HAVE_MMSG
  uv_once(&once, uv__udp_mmsg_init);
  if (uv__sendmmsg_avail) {
    uv__udp_sendmmsg(handle);
    return;
  }
#endif

  while (!QUEUE_EMPTY(&handle->write_queue)) {
    q = QUEUE_HEAD(&handle->write_queue);
    assert(q != NULL);

    req = QUEUE_DATA(q, uv_udp_send_t, queue);
    assert(req != NULL);

    memset(&h, 0, sizeof h);
    if (req->addr.ss_family == AF_UNSPEC) {
      h.msg_name = NULL;
      h.msg_namelen = 0;
    } else {
      h.msg_name = &req->addr;
      if (req->addr.ss_family == AF_INET6)
        h.msg_namelen = sizeof(struct sockaddr_in6);
      else if (req->addr.ss_family == AF_INET)
        h.msg_namelen = sizeof(struct sockaddr_in);
      else if (req->addr.ss_family == AF_UNIX)
        h.msg_namelen = sizeof(struct sockaddr_un);
      else {
        assert(0 && "unsupported address family");
        abort();
      }
    }
    h.msg_iov = (struct iovec*) req->bufs;
    h.msg_iovlen = req->nbufs;

    do {
      size = sendmsg(handle->io_watcher.fd, &h, 0);
    } while (size == -1 && errno == EINTR);

    if (size == -1) {
      if (errno == EAGAIN || errno == EWOULDBLOCK || errno == ENOBUFS)
        break;
    }

    req->status = (size == -1 ? UV__ERR(errno) : size);

    /* Sending a datagram is an atomic operation: either all data
     * is written or nothing is (and EMSGSIZE is raised). That is
     * why we don't handle partial writes. Just pop the request
     * off the write queue and onto the completed queue, done.
     */
    QUEUE_REMOVE(&req->queue);
    QUEUE_INSERT_TAIL(&handle->write_completed_queue, &req->queue);
    uv__io_feed(handle->loop, &handle->io_watcher);
  }
}